

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

bool __thiscall Catch::Matchers::WithinUlpsMatcher::match(WithinUlpsMatcher *this,double *matchee)

{
  ReusableStringStream *pRVar1;
  string *in_RDI;
  SourceLineInfo *in_stack_ffffffffffffff68;
  ReusableStringStream *in_stack_ffffffffffffff70;
  double in_stack_ffffffffffffff78;
  float in_stack_ffffffffffffff80;
  SourceLineInfo local_58 [5];
  bool local_1;
  
  if (in_RDI[1].field_2._M_local_buf[8] == '\0') {
    local_1 = anon_unknown_26::almostEqualUlps<float>
                        (in_stack_ffffffffffffff80,(float)((ulong)in_stack_ffffffffffffff78 >> 0x20)
                         ,(uint64_t)in_stack_ffffffffffffff70);
  }
  else {
    if (in_RDI[1].field_2._M_local_buf[8] != '\x01') {
      ReusableStringStream::ReusableStringStream(in_stack_ffffffffffffff70);
      SourceLineInfo::SourceLineInfo
                (local_58,
                 "/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/third_party/catch2v3_amalgamated/catch_amalgamated.cpp"
                 ,0x1fc7);
      ReusableStringStream::operator<<(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
      pRVar1 = ReusableStringStream::operator<<
                         (in_stack_ffffffffffffff70,(char (*) [26])in_stack_ffffffffffffff68);
      pRVar1 = ReusableStringStream::operator<<(pRVar1,(char (*) [40])in_stack_ffffffffffffff68);
      ReusableStringStream::str_abi_cxx11_(pRVar1);
      throw_logic_error(in_RDI);
    }
    local_1 = anon_unknown_26::almostEqualUlps<double>
                        (in_stack_ffffffffffffff78,(double)in_stack_ffffffffffffff70,
                         (uint64_t)in_stack_ffffffffffffff68);
  }
  return local_1;
}

Assistant:

bool WithinUlpsMatcher::match(double const& matchee) const {
        switch (m_type) {
        case Detail::FloatingPointKind::Float:
            return almostEqualUlps<float>(static_cast<float>(matchee), static_cast<float>(m_target), m_ulps);
        case Detail::FloatingPointKind::Double:
            return almostEqualUlps<double>(matchee, m_target, m_ulps);
        default:
            CATCH_INTERNAL_ERROR( "Unknown Detail::FloatingPointKind value" );
        }
    }